

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O3

bool verifyResult(string *objI,string *objJ,double distance,Point3 *p1,Point3 *p2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  long *plVar7;
  size_type *psVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dd;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  string local_c0;
  double local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  Vector3 local_78;
  Vector3 local_58;
  Point3 *local_40;
  double local_38;
  
  local_a0 = 0.0;
  local_78.m_z = 0.0;
  local_78.m_x = 0.0;
  local_78.m_y = 0.0;
  local_58.m_z = 0.0;
  local_58.m_x = 0.0;
  local_58.m_y = 0.0;
  local_38 = distance;
  iVar5 = std::__cxx11::string::compare((char *)objJ);
  if (iVar5 == 0) {
    iVar5 = std::__cxx11::string::compare((char *)objI);
    if (iVar5 != 0) goto LAB_00102efc;
    local_a0 = -0.003622207057881;
    local_78.m_x = 0.157367547718;
    local_78.m_y = 0.68942718023;
    local_78.m_z = 0.891961713557;
    local_58.m_x = 0.0986621048016;
    uVar9 = 0x1e96486e;
    uVar10 = 0x3fe61e73;
    uVar11 = 0x1022b316;
    uVar12 = 0x3fecf699;
  }
  else {
LAB_00102efc:
    iVar5 = std::__cxx11::string::compare((char *)objJ);
    if (iVar5 == 0) {
      iVar5 = std::__cxx11::string::compare((char *)objI);
      if (iVar5 == 0) {
        local_a0 = 1.052877530262;
        local_78.m_x = 0.113009188603;
        local_78.m_y = 0.657740931859;
        local_78.m_z = 0.866412634224;
        local_58.m_x = 0.404379849329;
        uVar9 = 0x6294fc69;
        uVar10 = 0x3f9392f5;
        uVar11 = 0xb2e30b53;
        uVar12 = 0x3fbe3486;
        goto LAB_00103036;
      }
    }
    iVar5 = std::__cxx11::string::compare((char *)objJ);
    if (iVar5 != 0) goto LAB_0010303e;
    iVar5 = std::__cxx11::string::compare((char *)objI);
    if (iVar5 != 0) goto LAB_0010303e;
    local_a0 = 0.7165631886362;
    local_78.m_x = 0.167062414197;
    local_78.m_y = 0.581943658784;
    local_78.m_z = 0.704052592159;
    local_58.m_x = 0.404383200422;
    uVar9 = 0x65599298;
    uVar10 = 0x3f939e1a;
    uVar11 = 0x2f08cd2f;
    uVar12 = 0x3fbe3217;
  }
LAB_00103036:
  local_58.m_y = (double)CONCAT44(uVar10,uVar9);
  local_58.m_z = (double)CONCAT44(uVar12,uVar11);
LAB_0010303e:
  std::operator+(&local_98,"distance (",objI);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_d0 = *plVar7;
    lStack_c8 = plVar6[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *plVar7;
    local_e0 = (long *)*plVar6;
  }
  local_d8 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_e0,(ulong)(objJ->_M_dataplus)._M_p);
  local_100 = &local_f0;
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_f0 = *plVar7;
    lStack_e8 = plVar6[3];
  }
  else {
    local_f0 = *plVar7;
    local_100 = (long *)*plVar6;
  }
  local_f8 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_100);
  paVar1 = &local_c0.field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_c0.field_2._M_allocated_capacity = *psVar8;
    local_c0.field_2._8_8_ = plVar6[3];
    local_c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar8;
    local_c0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_c0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_40 = p2;
  bVar2 = compare<double>(&local_38,&local_a0,&local_c0,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_98,"p1 (",objI);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_d0 = *plVar7;
    lStack_c8 = plVar6[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *plVar7;
    local_e0 = (long *)*plVar6;
  }
  local_d8 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_e0,(ulong)(objJ->_M_dataplus)._M_p);
  local_100 = &local_f0;
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_f0 = *plVar7;
    lStack_e8 = plVar6[3];
  }
  else {
    local_f0 = *plVar7;
    local_100 = (long *)*plVar6;
  }
  local_f8 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_100);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_c0.field_2._M_allocated_capacity = *psVar8;
    local_c0.field_2._8_8_ = plVar6[3];
    local_c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar8;
    local_c0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_c0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  bVar3 = compare(p1,&local_78,&local_c0,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_98,"p2 (",objI);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_d0 = *plVar7;
    lStack_c8 = plVar6[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *plVar7;
    local_e0 = (long *)*plVar6;
  }
  local_d8 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_e0,(ulong)(objJ->_M_dataplus)._M_p);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_f0 = *plVar7;
    lStack_e8 = plVar6[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *plVar7;
    local_100 = (long *)*plVar6;
  }
  local_f8 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_100);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_c0.field_2._M_allocated_capacity = *psVar8;
    local_c0.field_2._8_8_ = plVar6[3];
    local_c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar8;
    local_c0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_c0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  bVar4 = compare(local_40,&local_58,&local_c0,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return (bVar2 && bVar3) && bVar4;
}

Assistant:

bool verifyResult(const std::string & objI, const std::string & objJ,
                  double distance,
                  const Point3 & p1, const Point3 & p2)
{
  double dd(0);
  Point3 dp1(0, 0, 0);
  Point3 dp2(0, 0, 0);

  if(objJ== "poly" && objI == "stp1")
  {
#ifdef SCH_BUILD_BSD
    dd = 0.;
    dp1.Set(0.121221802197878, 0.759159100278684162432796, 0.8579643029474862681027);
    dp2.Set(0.131381168845752, 0.628304262885003295124874, 0.8892843622212902587875);
#else
    dd = -0.003622207057881;
    dp1.Set( 0.157367547718, 0.68942718023, 0.891961713557);
    dp2.Set(0.0986621048016, 0.691217002621, 0.905102283015);
#endif
  }
  else if(objJ == "poly" && objI == "stp2")
  {
    dd = 1.052877530262;
    dp1.Set(0.113009188603, 0.657740931859, 0.866412634224);
    dp2.Set(0.404379849329, 0.0191152898235, 0.117988985704);
  }
  else if(objJ == "stp1" && objI == "stp2")
  {
    dd = 0.7165631886362;
    dp1.Set(0.167062414197, 0.581943658784, 0.704052592159);
    dp2.Set(0.404383200422, 0.0191578029975, 0.117951821311);
  }

  bool res = true;
  res = compare(distance, dd, "distance ("+objI +", "+objJ+"): ") && res;
  res = compare(p1, dp1, "p1 ("+objI +", "+objJ+"): ") && res;
  res = compare(p2, dp2, "p2 ("+objI +", "+objJ+"): ") && res;
  return res;
}